

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPlugin.cpp
# Opt level: O0

void __thiscall
DISTRHO::Plugin::initAudioPort(Plugin *this,bool input,uint32_t index,AudioPort *port)

{
  char *pcVar1;
  String local_80;
  String local_68;
  String local_50;
  String local_38;
  AudioPort *local_20;
  AudioPort *port_local;
  uint32_t index_local;
  bool input_local;
  Plugin *this_local;
  
  local_20 = port;
  port_local._0_4_ = index;
  port_local._7_1_ = input;
  _index_local = this;
  if ((port->hints & 1) == 0) {
    pcVar1 = "Audio Output ";
    if (input) {
      pcVar1 = "Audio Input ";
    }
    String::operator=(&port->name,pcVar1);
    String::String(&local_68,(uint32_t)port_local + 1,false);
    String::operator+=(&local_20->name,&local_68);
    String::~String(&local_68);
    pcVar1 = "audio_out_";
    if ((port_local._7_1_ & 1) != 0) {
      pcVar1 = "audio_in_";
    }
    String::operator=(&local_20->symbol,pcVar1);
    String::String(&local_80,(uint32_t)port_local + 1,false);
    String::operator+=(&local_20->symbol,&local_80);
    String::~String(&local_80);
  }
  else {
    pcVar1 = "CV Output ";
    if (input) {
      pcVar1 = "CV Input ";
    }
    String::operator=(&port->name,pcVar1);
    String::String(&local_38,(uint32_t)port_local + 1,false);
    String::operator+=(&local_20->name,&local_38);
    String::~String(&local_38);
    pcVar1 = "cv_out_";
    if ((port_local._7_1_ & 1) != 0) {
      pcVar1 = "cv_in_";
    }
    String::operator=(&local_20->symbol,pcVar1);
    String::String(&local_50,(uint32_t)port_local + 1,false);
    String::operator+=(&local_20->symbol,&local_50);
    String::~String(&local_50);
  }
  return;
}

Assistant:

void Plugin::initAudioPort(bool input, uint32_t index, AudioPort& port)
{
    if (port.hints & kAudioPortIsCV)
    {
        port.name    = input ? "CV Input " : "CV Output ";
        port.name   += String(index+1);
        port.symbol  = input ? "cv_in_" : "cv_out_";
        port.symbol += String(index+1);
    }
    else
    {
        port.name    = input ? "Audio Input " : "Audio Output ";
        port.name   += String(index+1);
        port.symbol  = input ? "audio_in_" : "audio_out_";
        port.symbol += String(index+1);
    }
}